

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

uint8 __thiscall rw::ColorQuant::findColor(ColorQuant *this,RGBA color)

{
  Node *pNVar1;
  uint uVar2;
  int iVar3;
  Node *pNVar4;
  
  uVar2 = makeTreeAddr(color);
  iVar3 = -8;
  pNVar4 = this->root;
  do {
    pNVar1 = pNVar4->children[uVar2 & 0xf];
    if (pNVar1 == (Node *)0x0) break;
    uVar2 = uVar2 >> 4;
    iVar3 = iVar3 + 1;
    pNVar4 = pNVar1;
  } while (iVar3 != 0);
  return (uint8)pNVar4->numPixels;
}

Assistant:

uint8
ColorQuant::findColor(RGBA color)
{
	uint32 addr = makeTreeAddr(color);
	ColorQuant::Node *node = this->findNode(root, addr, QUANTDEPTH);
	return node->numPixels;
}